

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O1

bool __thiscall
RealTrafficConnection::ProcessRecvedTrafficData(RealTrafficConnection *this,char *traffic)

{
  char *__nptr;
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  int *piVar7;
  ulong numId;
  undefined8 uVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tfc;
  string acFilter;
  FDKeyTy fdKey;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  int local_a4;
  string local_a0;
  undefined1 local_80 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  if ((traffic == (char *)0x0) || (*traffic == '\0')) {
    return false;
  }
  LTOnlineChannel::DebugLogRaw((LTOnlineChannel *)this,traffic,-2,true);
  this->lastReceivedTime = dataRefs.lastSimTime;
  local_80._0_8_ = local_80 + 0x10;
  sVar6 = strlen(traffic);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,traffic,traffic + sVar6);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,",()","");
  str_tokenize(&local_c0,(string *)local_80,&local_a0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  if ((ulong)((long)local_c0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_c0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x160) {
    if ((int)dataRefs.iLogLevel < 3) {
      bVar4 = false;
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
             ,0x6de,"ProcessRecvedTrafficData",logWARN,"RealTraffic: Discarded invalid message: %s",
             traffic);
      goto LAB_00199008;
    }
LAB_00198dab:
    bVar4 = false;
    goto LAB_00199008;
  }
  __nptr = local_c0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
  piVar7 = __errno_location();
  local_a4 = *piVar7;
  *piVar7 = 0;
  numId = strtoul(__nptr,(char **)local_80,10);
  if ((char *)local_80._0_8_ == __nptr) {
    uVar8 = std::__throw_invalid_argument("stoul");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._8_8_ != &local_68) {
      operator_delete((void *)local_80._8_8_,local_68._0_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c0);
    _Unwind_Resume(uVar8);
  }
  if (*piVar7 == 0) {
    *piVar7 = local_a4;
  }
  else if (*piVar7 == 0x22) {
    std::__throw_out_of_range("stoul");
    goto LAB_00198dab;
  }
  bVar4 = true;
  if ((numId == 0) || (bVar3 = IsDatagramDuplicate(this,numId,traffic), bVar3)) goto LAB_00199008;
  LTFlightData::FDKeyTy::FDKeyTy((FDKeyTy *)local_80,(uint)(numId < 0x1000000) * 2 + KEY_RT,numId);
  DataRefs::GetDebugAcFilter_abi_cxx11_(&local_a0,&dataRefs);
  if (local_a0._M_string_length == 0) {
LAB_00198e66:
    bVar3 = false;
  }
  else {
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_a0._M_dataplus._M_p,
               local_a0._M_dataplus._M_p + local_a0._M_string_length);
    bVar3 = true;
    if (local_80._16_8_ == local_48) {
      if (local_80._16_8_ == 0) goto LAB_00198e66;
      iVar5 = bcmp((void *)local_80._8_8_,local_50,local_80._16_8_);
      bVar3 = iVar5 != 0;
    }
  }
  if ((local_a0._M_string_length != 0) && (local_50 != local_40)) {
    operator_delete(local_50,local_40[0] + 1);
  }
  pbVar2 = local_c0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = true;
  pbVar1 = local_c0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (!bVar3) {
    for (; pbVar1 != pbVar2; pbVar1 = pbVar1 + 1) {
      iVar5 = std::__cxx11::string::compare((char *)pbVar1);
      if (iVar5 == 0) {
        pbVar1->_M_string_length = 0;
        *(pbVar1->_M_dataplus)._M_p = '\0';
      }
    }
    iVar5 = std::__cxx11::string::compare
                      ((char *)local_c0.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
    if (iVar5 == 0) {
      if (0x53f < (ulong)((long)local_c0.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_c0.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)) {
        bVar4 = ProcessRTTFC(this,(FDKeyTy *)local_80,&local_c0);
        goto LAB_00198fd1;
      }
      iVar5 = 0x702;
    }
    else {
      iVar5 = std::__cxx11::string::compare
                        ((char *)local_c0.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
      if (iVar5 == 0) {
        if (0x1df < (ulong)((long)local_c0.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_c0.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)) {
LAB_00198fbd:
          bVar4 = ProcessAITFC(this,(FDKeyTy *)local_80,&local_c0);
          goto LAB_00198fd1;
        }
        iVar5 = 0x708;
      }
      else {
        iVar5 = std::__cxx11::string::compare
                          ((char *)local_c0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
        if (iVar5 == 0) {
          if (0x15f < (ulong)((long)local_c0.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_c0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)) goto LAB_00198fbd;
          iVar5 = 0x70e;
        }
        else {
          iVar5 = 0x714;
        }
      }
    }
    if ((int)dataRefs.iLogLevel < 3) {
      bVar4 = false;
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
             ,iVar5,"ProcessRecvedTrafficData",logWARN,"RealTraffic: Discarded invalid message: %s",
             traffic);
    }
    else {
      bVar4 = false;
    }
  }
LAB_00198fd1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._8_8_ != &local_68) {
    operator_delete((void *)local_80._8_8_,local_68._0_8_ + 1);
  }
LAB_00199008:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0);
  return bVar4;
}

Assistant:

bool RealTrafficConnection::ProcessRecvedTrafficData (const char* traffic)
{
    // sanity check: not empty
    if (!traffic || !traffic[0])
        return false;
    
    // Raw data logging
    DebugLogRaw(traffic, HTTP_FLAG_UDP);
    lastReceivedTime = dataRefs.GetSimTime();
    
    // split the datagram up into its parts, keeping empty positions empty
    std::vector<std::string> tfc = str_tokenize(traffic, ",()", false);
    
    // not enough fields found for any message?
    if (tfc.size() < RT_MIN_TFC_FIELDS)
    { LOG_MSG(logWARN, ERR_RT_DISCARDED_MSG, traffic); return false; }
    
    // *** Duplicaton Check ***
    
    // comes in all 3 formats at position 1 and in decimal form
    const unsigned long numId = std::stoul(tfc[RT_AITFC_HEXID]);
    
    // ignore aircraft, which don't want to be tracked
    if (numId == 0)
        return true;            // ignore silently
    
    // RealTraffic sends bursts of data often, but that doesn't necessarily
    // mean that anything really moved. Data could be stale.
    // So here we just completely ignore data which looks exactly like the previous datagram
    if (IsDatagramDuplicate(numId, traffic))
        return true;            // ignore silently

    // key is most likely an Icao transponder code, but could also be a Realtraffic internal id
    LTFlightData::FDKeyTy fdKey (numId <= MAX_TRANSP_ICAO ? LTFlightData::KEY_ICAO : LTFlightData::KEY_RT,
                                 numId);
    
    // not matching a/c filter? -> skip it
    const std::string acFilter ( dataRefs.GetDebugAcFilter() );
    if ((!acFilter.empty() && (fdKey != acFilter)))
        return true;            // silently

    // *** Replace 'null' ***
    std::for_each(tfc.begin(), tfc.end(),
                  [](std::string& s){ if (s == "null") s.clear(); });
    
    // *** Process different formats ****
    
    // There are 3 formats we are _really_ interested in: RTTFC, AITFC, and XTRAFFICPSX
    // Check for them and their correct number of fields
    if (tfc[RT_RTTFC_REC_TYPE] == RT_TRAFFIC_RTTFC) {
        if (tfc.size() < RT_RTTFC_MIN_TFC_FIELDS)
        { LOG_MSG(logWARN, ERR_RT_DISCARDED_MSG, traffic); return false; }

        return ProcessRTTFC(fdKey, tfc);
    }
    else if (tfc[RT_AITFC_REC_TYPE] == RT_TRAFFIC_AITFC) {
        if (tfc.size() < RT_AITFC_NUM_FIELDS_MIN)
        { LOG_MSG(logWARN, ERR_RT_DISCARDED_MSG, traffic); return false; }

        return ProcessAITFC(fdKey, tfc);
    }
    else if (tfc[RT_AITFC_REC_TYPE] == RT_TRAFFIC_XTRAFFICPSX) {
        if (tfc.size() < RT_XTRAFFICPSX_NUM_FIELDS)
        { LOG_MSG(logWARN, ERR_RT_DISCARDED_MSG, traffic); return false; }

        return ProcessAITFC(fdKey, tfc);
    }
    else {
        // other format than AITFC or XTRAFFICPSX
        LOG_MSG(logWARN, ERR_RT_DISCARDED_MSG, traffic);
        return false;
    }
}